

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O1

Float sRGBRoundTrip(Float v,Float dither)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  ulong uVar4;
  undefined1 in_register_00001204 [60];
  undefined1 auVar5 [64];
  undefined1 in_register_00001244 [12];
  Float FVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  auVar5._4_60_ = in_register_00001204;
  auVar5._0_4_ = v;
  FVar6 = 0.0;
  if ((0.0 <= v) && (FVar6 = 1.0, v <= 1.0)) {
    if (v <= 0.0) {
      uVar4 = 0;
    }
    else {
      uVar4 = 0xff;
      if (v < 1.0) {
        uVar3 = (uint)(v * 256.0);
        auVar7._0_12_ = ZEXT812(0);
        auVar7._12_4_ = 0;
        auVar8 = ZEXT816(0) << 0x40;
        if (-1 < (int)uVar3) {
          if ((int)uVar3 < 0x100) {
            auVar8 = vfmadd213ss_fma(ZEXT416(*(uint *)(pbrt::LinearToSRGBPiecewise +
                                                      (ulong)uVar3 * 8 + 4)),auVar5._0_16_,
                                     ZEXT416(*(uint *)(pbrt::LinearToSRGBPiecewise +
                                                      (ulong)uVar3 * 8)));
          }
          else {
            auVar8 = SUB6416(ZEXT464(0x3f800000),0);
          }
        }
        auVar2._4_12_ = in_register_00001244;
        auVar2._0_4_ = dither;
        auVar2 = vfmadd213ss_fma(auVar8,SUB6416(ZEXT464(0x437f0000),0),auVar2);
        auVar8 = vminss_avx(SUB6416(ZEXT464(0x437f0000),0),auVar2);
        uVar1 = vcmpss_avx512f(auVar2,auVar7,1);
        uVar4 = (ulong)((int)(float)((uint)!(bool)((byte)uVar1 & 1) * auVar8._0_4_) & 0xff);
      }
    }
    FVar6 = (Float)(&pbrt::SRGBToLinearLUT)[uVar4];
  }
  return FVar6;
}

Assistant:

static Float sRGBRoundTrip(Float v, Float dither = 0) {
    if (v < 0)
        return 0;
    else if (v > 1)
        return 1;
    uint8_t encoded = LinearToSRGB8(v, dither);
    return SRGB8ToLinear(encoded);
}